

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O3

void __thiscall
SmallVector_AppendIteratorRange_Test::TestBody(SmallVector_AppendIteratorRange_Test *this)

{
  char *message;
  array<int,_4UL> extra;
  small_vector<int,_4UL> a;
  AssertHelper local_90;
  char local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined8 uStack_60;
  int local_58 [6];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  void *local_28;
  undefined8 uStack_20;
  long local_18;
  undefined8 *local_10;
  
  local_10 = &local_38;
  local_40 = 4;
  local_28 = (void *)0x0;
  uStack_20 = 0;
  local_18 = 0;
  local_38 = 0x100000000;
  uStack_30 = 0x300000002;
  local_58[0] = 100;
  local_58[1] = 0x65;
  local_58[2] = 0x66;
  local_58[3] = 0x67;
  pstore::small_vector<int,4ul>::append<int*>
            ((small_vector<int,4ul> *)&local_40,local_58,local_58 + 4);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6600000067;
  uStack_70 = 0x6400000065;
  local_68 = &DAT_200000003;
  uStack_60 = 1;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int,int,int,int,int>>>
  ::operator()(local_88,(char *)&local_78,(small_vector<int,_4UL> *)0x1fcd7c);
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x130,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,local_18 - (long)local_28);
  }
  return;
}

Assistant:

TEST (SmallVector, SizeAfterResizeLarger) {
    pstore::small_vector<int, 4> b (std::size_t{4});
    std::size_t const size{10};
    b.resize (size);
    EXPECT_EQ (size, b.size ());
    EXPECT_GE (size, b.capacity ())
        << "expected capacity to be at least " << size << " (the container size)";
}